

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::ForceMatrixDecomposition::getInteratomicVector
          (Vector3d *__return_storage_ptr__,ForceMatrixDecomposition *this,int atom1,int atom2)

{
  pointer pVVar1;
  Vector<double,_3U> VStack_38;
  
  Vector<double,_3U>::Vector(&__return_storage_ptr__->super_Vector<double,_3U>);
  pVVar1 = (((this->super_ForceDecomposition).snap_)->atomData).position.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  operator-(&VStack_38,&pVVar1[atom2].super_Vector<double,_3U>,
            &pVVar1[atom1].super_Vector<double,_3U>);
  Vector3<double>::operator=(__return_storage_ptr__,&VStack_38);
  if ((this->super_ForceDecomposition).usePeriodicBoundaryConditions_ == true) {
    Snapshot::wrapVector((this->super_ForceDecomposition).snap_,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d ForceMatrixDecomposition::getInteratomicVector(int atom1,
                                                          int atom2) {
    Vector3d d;

#ifdef IS_MPI
    d = atomColData.position[atom2] - atomRowData.position[atom1];
#else
    d = snap_->atomData.position[atom2] - snap_->atomData.position[atom1];
#endif
    if (usePeriodicBoundaryConditions_) { snap_->wrapVector(d); }
    return d;
  }